

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::process_token_buff
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast)

{
  iterator *piVar1;
  token_base **pptVar2;
  token_base **pptVar3;
  _Map_pointer ppptVar4;
  _Map_pointer ppptVar5;
  _Elt_pointer pptVar6;
  _Map_pointer ppptVar7;
  _Elt_pointer pptVar8;
  _Map_pointer ppptVar9;
  _Map_pointer ppptVar10;
  _Elt_pointer pptVar11;
  int iVar12;
  _Map_pointer ppptVar13;
  context_t *pcVar14;
  long lVar15;
  iterator *piVar16;
  token_base **it;
  _Elt_pointer pptVar17;
  context_t *pcVar18;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *pdVar19;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *this_00;
  _Elt_pointer pptVar20;
  _Elt_pointer pptVar21;
  token_base **ptr;
  context_t *__args;
  _Map_pointer ppptVar22;
  token_base **ptr_1;
  byte bVar23;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_168;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_118;
  _Map_pointer local_110;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_108;
  context_t *local_b8;
  _Elt_pointer pptStack_b0;
  token_base **local_a8;
  _Elt_pointer local_a0;
  translator_type *local_98;
  context_t *local_90;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_88;
  
  bVar23 = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_118 = ast;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_88,0);
  local_108._M_impl.super__Deque_impl_data._M_finish._M_last = (token_base **)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_last = (token_base **)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_108,0);
  local_168._M_impl.super__Deque_impl_data._M_map =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map;
  local_168._M_impl.super__Deque_impl_data._M_map_size =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map_size;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  pcVar18 = (context_t *)&local_88;
  pdVar19 = tokens;
  for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pdVar19->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)
         (((_Deque_impl *)&pcVar18->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
          )->super__Deque_impl_data)._M_map;
    pcVar18 = (context_t *)
              &pcVar18[-(ulong)bVar23].
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    pdVar19 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              ((long)pdVar19 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  local_88._M_impl.super__Deque_impl_data._M_map = local_168._M_impl.super__Deque_impl_data._M_map;
  local_88._M_impl.super__Deque_impl_data._M_map_size =
       local_168._M_impl.super__Deque_impl_data._M_map_size;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish;
    local_110 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
    local_98 = &this->translator;
    local_90 = &this->context;
    local_a8 = (token_base **)&PTR__token_base_00334b88;
    local_a0 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar17 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar20 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
    __args = (context_t *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    do {
      iVar12 = (*(code *)(*(((_Deque_impl *)
                            &__args->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                           super__Deque_impl_data)._M_map)[2])();
      if ((iVar12 == 3) &&
         (*(int *)((((_Deque_impl *)
                    &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                   super__Deque_impl_data)._M_map + 2) == 0)) {
        ppptVar13 = (_Map_pointer)token_base::operator_new((token_base *)0x10,(size_t)pcVar18);
        ppptVar13[1] = (((_Deque_impl *)
                        &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                       super__Deque_impl_data)._M_map[1];
        *ppptVar13 = local_a8;
        (((_Deque_impl *)&__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
        ->super__Deque_impl_data)._M_map = ppptVar13;
      }
      iVar12 = (*(code *)(*(((_Deque_impl *)
                            &__args->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                           super__Deque_impl_data)._M_map)[2])();
      if ((iVar12 == 2) ||
         (iVar12 = (*(code *)(*(((_Deque_impl *)
                                &__args->
                                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                               super__Deque_impl_data)._M_map)[2])(), iVar12 == 1)) {
        if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_108._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pcVar18 = local_90;
          translator_type::match_grammar
                    (local_98,local_90,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_108);
          pptVar17 = local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pcVar14 = (context_t *)local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar2 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
          pptVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
          ppptVar22 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar5 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
          while (local_108._M_impl.super__Deque_impl_data._M_start._M_last = pptVar3,
                local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar4,
                local_108._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar5,
                pcVar14 != (context_t *)pptVar17) {
            pptVar21 = (tokens->
                       super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                       _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pptVar21 ==
                (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              pcVar18 = pcVar14;
              std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
              _M_push_back_aux<cs::token_base*const&>
                        ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                         (token_base **)pcVar14);
            }
            else {
              *pptVar21 = (token_base *)
                          (((_Deque_impl *)
                           &pcVar14->
                            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                          super__Deque_impl_data)._M_map;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            pcVar14 = (context_t *)
                      &(((_Deque_impl *)
                        &pcVar14->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
                       ->super__Deque_impl_data)._M_map_size;
            pptVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
            ppptVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
            ppptVar5 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
            if (pcVar14 == (context_t *)pptVar2) {
              pcVar14 = (context_t *)ppptVar22[1];
              ppptVar22 = ppptVar22 + 1;
              pptVar2 = (token_base **)(pcVar14 + 0x20);
            }
          }
          local_b8 = (context_t *)local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptStack_b0 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
          pptVar17 = local_a0;
          for (ppptVar22 = ppptVar4; local_a0 = pptVar17, ppptVar22 < ppptVar5;
              ppptVar22 = ppptVar22 + 1) {
            pcVar18 = (context_t *)0x200;
            operator_delete(ppptVar22[1],0x200);
            pptVar17 = local_a0;
          }
          local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_b8;
          local_108._M_impl.super__Deque_impl_data._M_finish._M_first = pptStack_b0;
          local_108._M_impl.super__Deque_impl_data._M_finish._M_last = pptVar3;
          local_108._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar4;
        }
        pcVar14 = (context_t *)
                  (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        piVar16 = piVar1;
        this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
        pptVar2 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_last;
      }
      else {
        this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_108;
        piVar16 = &local_108._M_impl.super__Deque_impl_data._M_finish;
        pcVar14 = (context_t *)local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar2 = local_108._M_impl.super__Deque_impl_data._M_finish._M_last;
      }
      if ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)pcVar14 ==
          (_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)(pptVar2 + -1)) {
        pcVar18 = __args;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*const&>(this_00,(token_base **)__args);
      }
      else {
        (((_Deque_impl *)&pcVar14->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
        ->super__Deque_impl_data)._M_map =
             (_Map_pointer)
             (((_Deque_impl *)
              &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
             super__Deque_impl_data)._M_map;
        piVar16->_M_cur = piVar16->_M_cur + 1;
      }
      __args = (context_t *)
               &(((_Deque_impl *)
                 &__args->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->
                super__Deque_impl_data)._M_map_size;
      if (__args == (context_t *)pptVar20) {
        __args = (context_t *)local_110[1];
        local_110 = local_110 + 1;
        pptVar20 = (_Elt_pointer)(__args + 0x20);
      }
    } while (__args != (context_t *)pptVar17);
  }
  local_168._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_168,0);
  pptVar20 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar17 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar20 != pptVar17) {
    pptVar21 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_last;
    ppptVar22 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
          local_168._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
          (local_168._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*const&>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_168,pptVar20);
      }
      else {
        (((_Deque_impl *)local_168._M_impl.super__Deque_impl_data._M_finish._M_cur)->
        super__Deque_impl_data)._M_map = (_Map_pointer)*pptVar20;
        local_168._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             &(((_Deque_impl *)local_168._M_impl.super__Deque_impl_data._M_finish._M_cur)->
              super__Deque_impl_data)._M_map_size;
      }
      if ((*pptVar20 != (token_base *)0x0) &&
         (iVar12 = (*(*pptVar20)->_vptr_token_base[2])(), iVar12 == 1)) {
        pcVar18 = (context_t *)local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar11 = local_168._M_impl.super__Deque_impl_data._M_start._M_first;
        pptVar6 = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
        ppptVar4 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
        ppptVar5 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
        ppptVar7 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
        if (1 < ((long)local_168._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_168._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                ((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)local_168._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                ((((ulong)((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_168._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)(local_168._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x40) {
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::push_back(local_118,(value_type *)&local_168);
          pcVar18 = (context_t *)local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar11 = local_168._M_impl.super__Deque_impl_data._M_start._M_first;
          pptVar6 = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
          ppptVar4 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar5 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar7 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
        }
        for (; pptStack_b0 = pptVar11, local_b8 = pcVar18,
            ppptVar10 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node,
            ppptVar9 = local_168._M_impl.super__Deque_impl_data._M_start._M_node,
            pptVar8 = local_168._M_impl.super__Deque_impl_data._M_start._M_last,
            ppptVar4 < local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppptVar4 = ppptVar4 + 1) {
          local_168._M_impl.super__Deque_impl_data._M_start._M_last = pptVar6;
          local_168._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar5;
          local_168._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar7;
          operator_delete(ppptVar4[1],0x200);
          pcVar18 = local_b8;
          pptVar11 = pptStack_b0;
          pptVar6 = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
          ppptVar5 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
          ppptVar7 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
          local_168._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar10;
          local_168._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar9;
          local_168._M_impl.super__Deque_impl_data._M_start._M_last = pptVar8;
        }
        local_168._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_168._M_impl.super__Deque_impl_data._M_start._M_last;
        local_168._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_168._M_impl.super__Deque_impl_data._M_start._M_node;
        local_168._M_impl.super__Deque_impl_data._M_start._M_last = pptVar6;
        local_168._M_impl.super__Deque_impl_data._M_start._M_node = ppptVar5;
        local_168._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)local_b8;
        local_168._M_impl.super__Deque_impl_data._M_finish._M_first = pptStack_b0;
      }
      pptVar20 = pptVar20 + 1;
      if (pptVar20 == pptVar21) {
        pptVar20 = ppptVar22[1];
        ppptVar22 = ppptVar22 + 1;
        pptVar21 = pptVar20 + 0x40;
      }
    } while (pptVar20 != pptVar17);
  }
  if (1 < ((long)local_168._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_168._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_168._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_168._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(local_168._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
          * 0x40) {
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back(local_118,(value_type *)&local_168);
  }
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_168);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_108);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
	compiler_type::process_token_buff(std::deque<token_base *> &tokens, std::deque<std::deque<token_base *>> &ast)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal &&
			        static_cast<token_signal *>(ptr)->get_signal() == signal_types::endline_)
				ptr = new token_endline(ptr->get_line_num());
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					translator.match_grammar(context, expr);
					for (auto &it: expr)
						tokens.push_back(it);
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
		std::deque<token_base *> tmp;
		for (auto &ptr: tokens) {
			tmp.push_back(ptr);
			if (ptr != nullptr && ptr->get_type() == token_types::endline) {
				if (tmp.size() > 1)
					ast.push_back(tmp);
				tmp.clear();
			}
		}
		if (tmp.size() > 1)
			ast.push_back(tmp);
	}